

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
ObjectTest_set_float_Test::~ObjectTest_set_float_Test(ObjectTest_set_float_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, set_float) {
	object obj;

	obj.set(13.37);

	EXPECT_TRUE(obj.has<double>());
	EXPECT_EQ(obj.get<double>(), 13.37);
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());

	obj.set(73.31);

	EXPECT_TRUE(obj.has<double>());
	EXPECT_EQ(obj.get<double>(), 73.31);
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());

	obj.set(0.0);

	EXPECT_TRUE(obj.has<double>());
	EXPECT_EQ(obj.get<double>(), 0.0);
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());
}